

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O1

void sendsuboption(connectdata *conn,int option)

{
  curl_off_t *pcVar1;
  char *buffer;
  curl_off_t *__buf;
  undefined2 uVar2;
  undefined2 uVar3;
  SessionHandle *data;
  HTTP *pHVar4;
  undefined1 *puVar5;
  long lVar6;
  ssize_t sVar7;
  uint *puVar8;
  
  if (option == 0x1f) {
    data = conn->data;
    pHVar4 = (data->state).proto.http;
    pcVar1 = &pHVar4[0x39].backup.postsize;
    *(undefined2 *)&pHVar4[0x36].postsize = 0xfaff;
    buffer = (char *)((long)&pHVar4[0x36].postsize + 3);
    pHVar4[0x39].backup.postsize = (curl_off_t)buffer;
    *(undefined1 *)((long)&pHVar4[0x36].postsize + 2) = 0x1f;
    uVar2 = *(undefined2 *)&pHVar4[0x35].send_buffer;
    uVar3 = *(undefined2 *)((long)&pHVar4[0x35].send_buffer + 2);
    if (buffer < pcVar1) {
      *pcVar1 = (curl_off_t)((long)&pHVar4[0x36].postsize + 4);
      *buffer = (char)((ushort)uVar2 >> 8);
    }
    puVar5 = (undefined1 *)*pcVar1;
    if (puVar5 < pcVar1) {
      *pcVar1 = (curl_off_t)(puVar5 + 1);
      *puVar5 = (char)uVar2;
    }
    puVar5 = (undefined1 *)*pcVar1;
    if (puVar5 < pcVar1) {
      *pcVar1 = (curl_off_t)(puVar5 + 1);
      *puVar5 = (char)((ushort)uVar3 >> 8);
    }
    puVar5 = (undefined1 *)*pcVar1;
    if (puVar5 < pcVar1) {
      *pcVar1 = (curl_off_t)(puVar5 + 1);
      *puVar5 = (char)uVar3;
    }
    puVar5 = (undefined1 *)*pcVar1;
    if (puVar5 < pcVar1) {
      *pcVar1 = (curl_off_t)(puVar5 + 1);
      *puVar5 = 0xff;
    }
    __buf = &pHVar4[0x36].postsize;
    puVar5 = (undefined1 *)*pcVar1;
    if (puVar5 < pcVar1) {
      *pcVar1 = (curl_off_t)(puVar5 + 1);
      *puVar5 = 0xf0;
    }
    lVar6 = pHVar4[0x39].backup.postsize;
    *(long *)&pHVar4[0x39].sending = lVar6;
    pHVar4[0x39].backup.postsize = (curl_off_t)__buf;
    printsub(data,0x3e,(uchar *)((long)&pHVar4[0x36].postsize + 2),(lVar6 - (long)__buf) - 2);
    sVar7 = send(conn->sock[0],__buf,3,0x4000);
    if (sVar7 < 0) {
      puVar8 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar8);
    }
    send_telnet_data(conn,buffer,4);
    sVar7 = send(conn->sock[0],(void *)((long)&pHVar4[0x36].postsize + 7),2,0x4000);
    if (sVar7 < 0) {
      puVar8 = (uint *)__errno_location();
      Curl_failf(data,"Sending data failed (%d)",(ulong)*puVar8);
      return;
    }
  }
  return;
}

Assistant:

static void sendsuboption(struct connectdata *conn, int option)
{
  ssize_t bytes_written;
  int err;
  unsigned short x, y;
  unsigned char*uc1, *uc2;

  struct SessionHandle *data = conn->data;
  struct TELNET *tn = (struct TELNET *)data->state.proto.telnet;

  switch (option) {
  case CURL_TELOPT_NAWS:
    /* We prepare data to be sent */
    CURL_SB_CLEAR(tn);
    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SB);
    CURL_SB_ACCUM(tn, CURL_TELOPT_NAWS);
    /* We must deal either with litte or big endien processors */
    /* Window size must be sent according to the 'network order' */
    x=htons(tn->subopt_wsx);
    y=htons(tn->subopt_wsy);
    uc1 = (unsigned char*)&x;
    uc2 = (unsigned char*)&y;
    CURL_SB_ACCUM(tn, uc1[0]);
    CURL_SB_ACCUM(tn, uc1[1]);
    CURL_SB_ACCUM(tn, uc2[0]);
    CURL_SB_ACCUM(tn, uc2[1]);

    CURL_SB_ACCUM(tn, CURL_IAC);
    CURL_SB_ACCUM(tn, CURL_SE);
    CURL_SB_TERM(tn);
    /* data suboption is now ready */

    printsub(data, '>', (unsigned char *)tn->subbuffer+2,
             CURL_SB_LEN(tn)-2);

    /* we send the header of the suboption... */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer, 3);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    /* ... then the window size with the send_telnet_data() function
       to deal with 0xFF cases ... */
    send_telnet_data(conn, (char *)tn->subbuffer+3, 4);
    /* ... and the footer */
    bytes_written = swrite(conn->sock[FIRSTSOCKET], tn->subbuffer+7, 2);
    if(bytes_written < 0) {
      err = SOCKERRNO;
      failf(data, "Sending data failed (%d)", err);
    }
    break;
  }
}